

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog-inl.h
# Opt level: O0

void spdlog::set_pattern(string *pattern,pattern_time_type time_type)

{
  undefined4 in_ESI;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *in_RDI;
  pointer in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined4 in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  custom_flags *custom_user_flags;
  string *eol;
  pattern_time_type time_type_00;
  string *pattern_00;
  pattern_formatter *in_stack_ffffffffffffff90;
  allocator<char> local_59 [65];
  undefined4 local_c;
  
  local_c = in_ESI;
  operator_new(0xe0);
  uVar1 = 1;
  std::__cxx11::string::string(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
             (allocator<char> *)CONCAT17(uVar1,in_stack_ffffffffffffff50));
  eol = (string *)0x0;
  time_type_00 = local;
  custom_user_flags = (custom_flags *)0x0;
  pattern_00 = (string *)0x0;
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::unordered_map((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                   *)0x5d7983);
  pattern_formatter::pattern_formatter
            (in_stack_ffffffffffffff90,pattern_00,time_type_00,eol,custom_user_flags);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xffffffffffffffe8;
  std::unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>>::
  unique_ptr<std::default_delete<spdlog::formatter>,void>
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)this,
             in_stack_ffffffffffffff18);
  set_formatter((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                CONCAT44(local_c,in_stack_ffffffffffffff40));
  CLI::std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            (in_RDI);
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::~unordered_map((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                    *)0x5d79e7);
  std::__cxx11::string::~string(this);
  std::allocator<char>::~allocator(local_59);
  std::__cxx11::string::~string(this);
  return;
}

Assistant:

SPDLOG_INLINE void set_pattern(std::string pattern, pattern_time_type time_type) {
    set_formatter(
        std::unique_ptr<spdlog::formatter>(new pattern_formatter(std::move(pattern), time_type)));
}